

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turn.cpp
# Opt level: O1

bool __thiscall Turn::removeTurn(Turn *this,NurseSolution *nurseSolution)

{
  NurseSolution **__src;
  pointer *pppNVar1;
  NurseSolution **ppNVar2;
  bool bVar3;
  __normal_iterator<NurseSolution_**,_std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>_>
  _Var4;
  NurseSolution *local_18;
  NurseSolution *local_10;
  
  local_18 = nurseSolution;
  local_10 = nurseSolution;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<NurseSolution**,std::vector<NurseSolution*,std::allocator<NurseSolution*>>>,__gnu_cxx::__ops::_Iter_equals_val<NurseSolution_const*const>>
                    ((this->nurses).
                     super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->nurses).
                     super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if ((_Var4._M_current !=
       (this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
       super__Vector_impl_data._M_finish) && (bVar3 = NurseSolution::hasTurn(local_18,this), bVar3))
  {
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<NurseSolution**,std::vector<NurseSolution*,std::allocator<NurseSolution*>>>,__gnu_cxx::__ops::_Iter_equals_val<NurseSolution*const>>
                      ((this->nurses).
                       super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl
                       .super__Vector_impl_data._M_start,
                       (this->nurses).
                       super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl
                       .super__Vector_impl_data._M_finish,&local_18);
    __src = _Var4._M_current + 1;
    ppNVar2 = (this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (__src != ppNVar2) {
      memmove(_Var4._M_current,__src,(long)ppNVar2 - (long)__src);
    }
    pppNVar1 = &(this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + -1;
    NurseSolution::removeTurn(local_18,this);
    return true;
  }
  return false;
}

Assistant:

const bool Turn::removeTurn(NurseSolution *nurseSolution) {
    if (!hasNurse(nurseSolution) || !nurseSolution->hasTurn(this))
        return false;

    nurses.erase(find(begin(nurses), end(nurses), nurseSolution));
    nurseSolution->removeTurn(this);

    return true;
}